

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O2

void __thiscall CSR::CSR(CSR *this,int r,int c,int nz,int *p,int *ind,double *x)

{
  int i;
  int *__s;
  int *__s_00;
  double *__s_01;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  this->row = r;
  this->col = c;
  this->nonzero = nz;
  uVar2 = (ulong)(r + 1) << 2;
  if (r < -1) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(uVar2);
  lVar3 = 0;
  memset(__s,0,uVar2);
  this->ptr = __s;
  uVar2 = (long)nz * 4;
  if (nz < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  uVar1 = (long)nz * 8;
  if (nz < 0) {
    uVar1 = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(uVar2);
  memset(__s_00,0,uVar2);
  this->idx = __s_00;
  __s_01 = (double *)operator_new__(uVar1);
  memset(__s_01,0,uVar1);
  this->val = __s_01;
  for (; lVar3 <= r; lVar3 = lVar3 + 1) {
    __s[lVar3] = p[lVar3];
  }
  uVar1 = 0;
  uVar2 = (ulong)(uint)nz;
  if (nz < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    __s_00[uVar1] = ind[uVar1];
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    __s_01[uVar1] = x[uVar1];
  }
  return;
}

Assistant:

CSR::CSR(int r, int c, int nz, int *p, int *ind, double *x)
{
    row = r;
    col = c;
    nonzero = nz;
    ptr = new int[row+1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = p[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = ind[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = x[i];
    }

}